

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

const_buffer webfront::http::std::experimental::net::v1::operator+(const_buffer *b,size_t n)

{
  size_t sVar1;
  void *pvVar2;
  ulong in_RSI;
  const_buffer *in_RDI;
  size_t new_size;
  char *new_data;
  size_t offset;
  size_t local_48;
  const_buffer local_10;
  
  sVar1 = const_buffer::size(in_RDI);
  local_48 = in_RSI;
  if (sVar1 <= in_RSI) {
    local_48 = const_buffer::size(in_RDI);
  }
  pvVar2 = const_buffer::data(in_RDI);
  sVar1 = const_buffer::size(in_RDI);
  const_buffer::const_buffer(&local_10,(void *)((long)pvVar2 + local_48),sVar1 - local_48);
  return local_10;
}

Assistant:

inline const_buffer operator+(const const_buffer& b,
    std::size_t n) NET_TS_NOEXCEPT
{
  std::size_t offset = n < b.size() ? n : b.size();
  const char* new_data = static_cast<const char*>(b.data()) + offset;
  std::size_t new_size = b.size() - offset;
  return const_buffer(new_data, new_size
#if defined(NET_TS_ENABLE_BUFFER_DEBUGGING)
      , b.get_debug_check()
#endif // NET_TS_ENABLE_BUFFER_DEBUGGING
      );
}